

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong_conflict helper_modsub_mipsel(target_ulong_conflict rs,target_ulong_conflict rt)

{
  uint uVar1;
  
  uVar1 = rt >> 8 & 0xffff;
  if (rs != 0) {
    uVar1 = rs - (rt & 0xff);
  }
  return uVar1;
}

Assistant:

target_ulong helper_modsub(target_ulong rs, target_ulong rt)
{
    int32_t decr;
    uint16_t lastindex;
    target_ulong rd;

    decr = rt & MIPSDSP_Q0;
    lastindex = (rt >> 8) & MIPSDSP_LO;

    if ((rs & MIPSDSP_LLO) == 0x00000000) {
        rd = (target_ulong)lastindex;
    } else {
        rd = rs - decr;
    }

    return rd;
}